

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyMan.c
# Opt level: O2

void Ivy_ManMakeSeq(Ivy_Man_t *p,int nLatches,int *pInits)

{
  ulong uVar1;
  Ivy_Obj_t *pIVar2;
  Ivy_Obj_t *pFan0;
  int iVar3;
  long lVar4;
  Ivy_Init_t Init;
  
  if (nLatches != 0) {
    if ((p->nObjs[1] <= nLatches) || (p->nObjs[2] <= nLatches)) {
      __assert_fail("nLatches < Ivy_ManPiNum(p) && nLatches < Ivy_ManPoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyMan.c"
                    ,0x1e9,"void Ivy_ManMakeSeq(Ivy_Man_t *, int, int *)");
    }
    if (p->nObjs[1] != p->vPis->nSize) {
      __assert_fail("Ivy_ManPiNum(p) == Vec_PtrSize(p->vPis)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyMan.c"
                    ,0x1ea,"void Ivy_ManMakeSeq(Ivy_Man_t *, int, int *)");
    }
    if (p->nObjs[2] != p->vPos->nSize) {
      __assert_fail("Ivy_ManPoNum(p) == Vec_PtrSize(p->vPos)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyMan.c"
                    ,0x1eb,"void Ivy_ManMakeSeq(Ivy_Man_t *, int, int *)");
    }
    if (p->vBufs->nSize != 0) {
      __assert_fail("Vec_PtrSize( p->vBufs ) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyMan.c"
                    ,0x1ec,"void Ivy_ManMakeSeq(Ivy_Man_t *, int, int *)");
    }
    if (p->fFanout == 0) {
      Ivy_ManStartFanout(p);
    }
    lVar4 = 0;
    uVar1 = 0;
    if (0 < nLatches) {
      uVar1 = (ulong)(uint)nLatches;
    }
    iVar3 = -nLatches;
    for (; uVar1 << 2 != lVar4; lVar4 = lVar4 + 4) {
      Init = IVY_INIT_0;
      if (pInits != (int *)0x0) {
        Init = *(Ivy_Init_t *)((long)pInits + lVar4);
      }
      pIVar2 = Ivy_ManPo(p,p->nObjs[2] + iVar3);
      pFan0 = Ivy_Latch(p,pIVar2->pFanin0,Init);
      Ivy_ObjDisconnect(p,pIVar2);
      Vec_PtrWriteEntry(p->vObjs,pIVar2->Id,(void *)0x0);
      pIVar2->field_0x8 = pIVar2->field_0x8 & 0xf0;
      *(Ivy_Obj_t **)pIVar2 = p->pListFree;
      p->pListFree = pIVar2;
      pIVar2 = Ivy_ManPi(p,p->nObjs[1] + iVar3);
      *(uint *)&pIVar2->field_0x8 = *(uint *)&pIVar2->field_0x8 & 0xfffffff0 | 7;
      Ivy_ObjConnect(p,pIVar2,pFan0,(Ivy_Obj_t *)0x0);
      Vec_PtrPush(p->vBufs,pIVar2);
      iVar3 = iVar3 + 1;
    }
    Vec_PtrShrink(p->vPis,p->nObjs[1] - nLatches);
    Vec_PtrShrink(p->vPos,p->nObjs[2] - nLatches);
    *(ulong *)(p->nObjs + 1) =
         CONCAT44((int)((ulong)*(undefined8 *)(p->nObjs + 1) >> 0x20) - nLatches,
                  (int)*(undefined8 *)(p->nObjs + 1) - nLatches);
    p->nObjs[7] = p->nObjs[7] + nLatches;
    p->nDeleted = p->nDeleted + nLatches * -2;
    Ivy_ManCleanup(p);
    Ivy_ManCleanupSeq(p);
    Ivy_ManPropagateBuffers(p,0);
    if (p->nObjs[7] != 0) {
      printf("The number of remaining buffers is %d.\n");
    }
    Ivy_ManResetLevels(p);
    iVar3 = Ivy_ManCheck(p);
    if (iVar3 == 0) {
      puts("Ivy_ManMakeSeq(): The check has failed.");
      return;
    }
  }
  return;
}

Assistant:

void Ivy_ManMakeSeq( Ivy_Man_t * p, int nLatches, int * pInits )
{
    Ivy_Obj_t * pObj, * pLatch;
    Ivy_Init_t Init;
    int i;
    if ( nLatches == 0 )
        return;
    assert( nLatches < Ivy_ManPiNum(p) && nLatches < Ivy_ManPoNum(p) );
    assert( Ivy_ManPiNum(p) == Vec_PtrSize(p->vPis) );
    assert( Ivy_ManPoNum(p) == Vec_PtrSize(p->vPos) );
    assert( Vec_PtrSize( p->vBufs ) == 0 );
    // create fanouts
    if ( p->fFanout == 0 )
        Ivy_ManStartFanout( p );
    // collect the POs to be converted into latches
    for ( i = 0; i < nLatches; i++ )
    {
        // get the latch value
        Init = pInits? (Ivy_Init_t)pInits[i] : IVY_INIT_0;
        // create latch
        pObj = Ivy_ManPo( p, Ivy_ManPoNum(p) - nLatches + i );
        pLatch = Ivy_Latch( p, Ivy_ObjChild0(pObj), Init );
        Ivy_ObjDisconnect( p, pObj );
        // recycle the old PO object
        Vec_PtrWriteEntry( p->vObjs, pObj->Id, NULL );
        Ivy_ManRecycleMemory( p, pObj );
        // convert the corresponding PI to a buffer and connect it to the latch
        pObj = Ivy_ManPi( p, Ivy_ManPiNum(p) - nLatches + i );
        pObj->Type = IVY_BUF;
        Ivy_ObjConnect( p, pObj, pLatch, NULL );
        // save the buffer
        Vec_PtrPush( p->vBufs, pObj );
    }
    // shrink the arrays
    Vec_PtrShrink( p->vPis, Ivy_ManPiNum(p) - nLatches );
    Vec_PtrShrink( p->vPos, Ivy_ManPoNum(p) - nLatches );
    // update the counters of different objects
    p->nObjs[IVY_PI] -= nLatches;
    p->nObjs[IVY_PO] -= nLatches;
    p->nObjs[IVY_BUF] += nLatches;
    p->nDeleted -= 2 * nLatches;
    // remove dangling nodes
    Ivy_ManCleanup(p);
    Ivy_ManCleanupSeq(p);
/* 
    // check for dangling nodes
    Ivy_ManForEachObj( p, pObj, i )
        if ( !Ivy_ObjIsPi(pObj) && !Ivy_ObjIsPo(pObj) && !Ivy_ObjIsConst1(pObj) )
        {
            assert( Ivy_ObjRefs(pObj) > 0 );
            assert( Ivy_ObjRefs(pObj) == Ivy_ObjFanoutNum(p, pObj) );
        }
*/
    // perform hashing by propagating the buffers
    Ivy_ManPropagateBuffers( p, 0 );
    if ( Ivy_ManBufNum(p) )
        printf( "The number of remaining buffers is %d.\n", Ivy_ManBufNum(p) );
    // fix the levels
    Ivy_ManResetLevels( p );
    // check the resulting network
    if ( !Ivy_ManCheck(p) )
        printf( "Ivy_ManMakeSeq(): The check has failed.\n" );
}